

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O0

void __thiscall
NumericArgTest_MakeAndVisit_Test<int>::TestBody(NumericArgTest_MakeAndVisit_Test<int> *this)

{
  MockSpec<test_result_(int)> *this_00;
  StrictMock<mock_visitor<int>_> *pSVar1;
  StrictMock<mock_visitor<int>_> visitor_5;
  StrictMock<mock_visitor<int>_> visitor_4;
  Type_conflict expected_2;
  StrictMock<mock_visitor<int>_> visitor_3;
  StrictMock<mock_visitor<int>_> visitor_2;
  Type_conflict expected_1;
  StrictMock<mock_visitor<int>_> visitor_1;
  StrictMock<mock_visitor<int>_> visitor;
  Type_conflict expected;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  *in_stack_fffffffffffff908;
  StrictMock<mock_visitor<int>_> *in_stack_fffffffffffff910;
  StrictMock<mock_visitor<int>_> *in_stack_fffffffffffff930;
  undefined8 in_stack_fffffffffffff938;
  int iVar2;
  Matcher<int> *in_stack_fffffffffffff940;
  char *in_stack_fffffffffffffa00;
  char *in_stack_fffffffffffffa08;
  int in_stack_fffffffffffffa14;
  char *in_stack_fffffffffffffa18;
  MockSpec<test_result_(int)> *in_stack_fffffffffffffa20;
  undefined1 local_410 [196];
  int local_34c;
  int local_244;
  type_conflict1 local_23c;
  type_conflict1 local_12c;
  type_conflict1 local_c;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffff938 >> 0x20);
  local_c = test_value<int>();
  testing::StrictMock<mock_visitor<int>_>::StrictMock(in_stack_fffffffffffff930);
  testing::Matcher<int>::Matcher(in_stack_fffffffffffff940,iVar2);
  mock_visitor<int>::gmock_visit
            ((mock_visitor<int> *)in_stack_fffffffffffff910,
             (Matcher<int> *)in_stack_fffffffffffff908);
  testing::internal::MockSpec<test_result_(int)>::InternalExpectedAt
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,in_stack_fffffffffffffa14,
             in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x14bf07);
  local_12c = test_value<int>();
  (anonymous_namespace)::
  make_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
            ((int *)in_stack_fffffffffffff910);
  fmt::v5::
  visit<testing::StrictMock<mock_visitor<int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (in_stack_fffffffffffff910,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)in_stack_fffffffffffff908);
  testing::StrictMock<mock_visitor<int>_>::~StrictMock(in_stack_fffffffffffff910);
  testing::StrictMock<mock_visitor<int>_>::StrictMock(in_stack_fffffffffffff930);
  testing::Matcher<int>::Matcher(in_stack_fffffffffffff940,iVar2);
  mock_visitor<int>::gmock_visit
            ((mock_visitor<int> *)in_stack_fffffffffffff910,
             (Matcher<int> *)in_stack_fffffffffffff908);
  testing::internal::MockSpec<test_result_(int)>::InternalExpectedAt
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,in_stack_fffffffffffffa14,
             in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x14bfd4);
  local_23c = test_value<int>();
  (anonymous_namespace)::
  make_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,int>
            ((int *)in_stack_fffffffffffff910);
  fmt::v5::
  visit<testing::StrictMock<mock_visitor<int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  testing::StrictMock<mock_visitor<int>_>::~StrictMock(in_stack_fffffffffffff910);
  local_244 = std::numeric_limits<int>::min();
  testing::StrictMock<mock_visitor<int>_>::StrictMock(in_stack_fffffffffffff930);
  testing::Matcher<int>::Matcher(in_stack_fffffffffffff940,iVar2);
  this_00 = mock_visitor<int>::gmock_visit
                      ((mock_visitor<int> *)in_stack_fffffffffffff910,
                       (Matcher<int> *)in_stack_fffffffffffff908);
  testing::internal::MockSpec<test_result_(int)>::InternalExpectedAt
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,in_stack_fffffffffffffa14,
             in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x14c0ad);
  local_34c = std::numeric_limits<int>::min();
  (anonymous_namespace)::
  make_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
            ((int *)in_stack_fffffffffffff910);
  fmt::v5::
  visit<testing::StrictMock<mock_visitor<int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (in_stack_fffffffffffff910,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)in_stack_fffffffffffff908);
  testing::StrictMock<mock_visitor<int>_>::~StrictMock(in_stack_fffffffffffff910);
  testing::StrictMock<mock_visitor<int>_>::StrictMock(in_stack_fffffffffffff930);
  iVar2 = (int)((ulong)local_410 >> 0x20);
  testing::Matcher<int>::Matcher((Matcher<int> *)this_00,iVar2);
  pSVar1 = (StrictMock<mock_visitor<int>_> *)
           mock_visitor<int>::gmock_visit
                     ((mock_visitor<int> *)in_stack_fffffffffffff910,
                      (Matcher<int> *)in_stack_fffffffffffff908);
  testing::internal::MockSpec<test_result_(int)>::InternalExpectedAt
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,in_stack_fffffffffffffa14,
             in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x14c170);
  std::numeric_limits<int>::min();
  (anonymous_namespace)::
  make_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,int>
            ((int *)in_stack_fffffffffffff910);
  fmt::v5::
  visit<testing::StrictMock<mock_visitor<int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  testing::StrictMock<mock_visitor<int>_>::~StrictMock(in_stack_fffffffffffff910);
  std::numeric_limits<int>::max();
  testing::StrictMock<mock_visitor<int>_>::StrictMock(pSVar1);
  testing::Matcher<int>::Matcher((Matcher<int> *)this_00,iVar2);
  mock_visitor<int>::gmock_visit
            ((mock_visitor<int> *)in_stack_fffffffffffff910,
             (Matcher<int> *)in_stack_fffffffffffff908);
  testing::internal::MockSpec<test_result_(int)>::InternalExpectedAt
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,in_stack_fffffffffffffa14,
             in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x14c23f);
  std::numeric_limits<int>::max();
  (anonymous_namespace)::
  make_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
            ((int *)in_stack_fffffffffffff910);
  fmt::v5::
  visit<testing::StrictMock<mock_visitor<int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (in_stack_fffffffffffff910,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)in_stack_fffffffffffff908);
  testing::StrictMock<mock_visitor<int>_>::~StrictMock(in_stack_fffffffffffff910);
  testing::StrictMock<mock_visitor<int>_>::StrictMock(pSVar1);
  testing::Matcher<int>::Matcher((Matcher<int> *)this_00,iVar2);
  pSVar1 = (StrictMock<mock_visitor<int>_> *)
           mock_visitor<int>::gmock_visit
                     ((mock_visitor<int> *)in_stack_fffffffffffff910,
                      (Matcher<int> *)in_stack_fffffffffffff908);
  testing::internal::MockSpec<test_result_(int)>::InternalExpectedAt
            (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,in_stack_fffffffffffffa14,
             in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x14c302);
  std::numeric_limits<int>::max();
  (anonymous_namespace)::
  make_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,int>
            ((int *)pSVar1);
  fmt::v5::
  visit<testing::StrictMock<mock_visitor<int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (pSVar1,in_stack_fffffffffffff908);
  testing::StrictMock<mock_visitor<int>_>::~StrictMock(pSVar1);
  return;
}

Assistant:

TYPED_TEST(NumericArgTest, MakeAndVisit) {
  CHECK_ARG(test_value<TypeParam>(), typename);
  CHECK_ARG(std::numeric_limits<TypeParam>::min(), typename);
  CHECK_ARG(std::numeric_limits<TypeParam>::max(), typename);
}